

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O3

void __thiscall embree::MutexSys::MutexSys(MutexSys *this)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  runtime_error *this_00;
  
  __mutex = (pthread_mutex_t *)operator_new(0x28);
  this->mutex = __mutex;
  iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"pthread_mutex_init failed");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

MutexSys::MutexSys() 
  { 
    mutex = new pthread_mutex_t; 
    if (pthread_mutex_init((pthread_mutex_t*)mutex, nullptr) != 0)
      THROW_RUNTIME_ERROR("pthread_mutex_init failed");
  }